

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O0

DdNode * Extra_bddEncodingBinary
                   (DdManager *dd,DdNode **pbFuncs,int nFuncs,DdNode **pbVars,int nVars)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *n;
  DdNode *bProd;
  DdNode *bTemp;
  DdNode *bCube;
  DdNode *bResult;
  int i;
  int nVars_local;
  DdNode **pbVars_local;
  int nFuncs_local;
  DdNode **pbFuncs_local;
  DdManager *dd_local;
  
  iVar1 = Abc_Base2Log(nFuncs);
  if (iVar1 <= nVars) {
    bCube = (DdNode *)((ulong)dd->one ^ 1);
    Cudd_Ref(bCube);
    for (bResult._0_4_ = 0; (int)bResult < nFuncs; bResult._0_4_ = (int)bResult + 1) {
      pDVar2 = Extra_bddBitsToCube(dd,(int)bResult,nVars,pbVars,1);
      Cudd_Ref(pDVar2);
      n = Cudd_bddAnd(dd,pDVar2,pbFuncs[(int)bResult]);
      Cudd_Ref(n);
      Cudd_RecursiveDeref(dd,pDVar2);
      pDVar2 = Cudd_bddOr(dd,n,bCube);
      Cudd_Ref(pDVar2);
      Cudd_RecursiveDeref(dd,bCube);
      Cudd_RecursiveDeref(dd,n);
      bCube = pDVar2;
    }
    Cudd_Deref(bCube);
    return bCube;
  }
  __assert_fail("nVars >= Abc_Base2Log(nFuncs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddCas.c"
                ,0x95,"DdNode *Extra_bddEncodingBinary(DdManager *, DdNode **, int, DdNode **, int)"
               );
}

Assistant:

DdNode * 
Extra_bddEncodingBinary( 
  DdManager * dd, 
  DdNode ** pbFuncs,    // pbFuncs is the array of columns to be encoded
  int nFuncs,           // nFuncs is the number of columns in the array
  DdNode ** pbVars,     // pbVars is the array of variables to use for the codes
  int nVars )           // nVars is the column multiplicity, [log2(nFuncs)]
{
    int i;
    DdNode * bResult;
    DdNode * bCube, * bTemp, * bProd;

    assert( nVars >= Abc_Base2Log(nFuncs) );

    bResult = b0;   Cudd_Ref( bResult );
    for ( i = 0; i < nFuncs; i++ )
    {
        bCube   = Extra_bddBitsToCube( dd, i, nVars, pbVars, 1 );   Cudd_Ref( bCube );
        bProd   = Cudd_bddAnd( dd, bCube, pbFuncs[i] );         Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bCube );

        bResult = Cudd_bddOr( dd, bProd, bTemp = bResult );     Cudd_Ref( bResult );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bProd );
    }

    Cudd_Deref( bResult );
    return bResult;
}